

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_stream.c
# Opt level: O3

int jas_stream_copy(jas_stream_t *out,jas_stream_t *in,int n)

{
  byte *pbVar1;
  uchar *puVar2;
  bool bVar3;
  uint c;
  int iVar4;
  int iVar5;
  
  iVar5 = n;
  if (n != 0) {
    do {
      if ((in->flags_ & 7U) != 0) {
LAB_00113ba2:
        if (n < 0) {
          return (in->flags_ << 0x1e) >> 0x1f;
        }
        return -1;
      }
      if ((-1 < in->rwlimit_) && (in->rwlimit_ <= in->rwcnt_)) {
        in->flags_ = in->flags_ | 4;
        goto LAB_00113ba2;
      }
      iVar4 = in->cnt_;
      in->cnt_ = iVar4 + -1;
      if (iVar4 < 1) {
        c = jas_stream_fillbuf(in,1);
        if (c == 0xffffffff) goto LAB_00113ba2;
      }
      else {
        in->rwcnt_ = in->rwcnt_ + 1;
        pbVar1 = in->ptr_;
        in->ptr_ = pbVar1 + 1;
        c = (uint)*pbVar1;
      }
      if ((out->flags_ & 7U) != 0) {
        return -1;
      }
      if ((-1 < out->rwlimit_) && (out->rwlimit_ <= out->rwcnt_)) {
        out->flags_ = out->flags_ | 4;
        return -1;
      }
      *(byte *)&out->bufmode_ = (byte)out->bufmode_ | 0x20;
      iVar4 = out->cnt_;
      out->cnt_ = iVar4 + -1;
      if (iVar4 < 1) {
        iVar4 = jas_stream_flushbuf(out,c);
        if (iVar4 == -1) {
          return -1;
        }
      }
      else {
        out->rwcnt_ = out->rwcnt_ + 1;
        puVar2 = out->ptr_;
        out->ptr_ = puVar2 + 1;
        *puVar2 = (uchar)c;
      }
      bVar3 = 1 < iVar5;
      iVar5 = iVar5 + -1;
    } while (bVar3 || n < 0);
  }
  return 0;
}

Assistant:

int jas_stream_copy(jas_stream_t *out, jas_stream_t *in, int n)
{
	int all;
	int c;
	int m;

	all = (n < 0) ? 1 : 0;

	m = n;
	while (all || m > 0) {
		if ((c = jas_stream_getc_macro(in)) == EOF) {
			/* The next character of input could not be read. */
			/* Return with an error if an I/O error occured
			  (not including EOF) or if an explicit copy count
			  was specified. */
			return (!all || jas_stream_error(in)) ? (-1) : 0;
		}
		if (jas_stream_putc_macro(out, c) == EOF) {
			return -1;
		}
		--m;
	}
	return 0;
}